

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::StandardNumericToDecimalCast<int,short,duckdb::SignedToDecimalOperator>
               (int input,short *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  short sVar3;
  long lVar4;
  undefined7 in_register_00000081;
  long lVar5;
  uchar in_R9B;
  string error;
  allocator local_69;
  Exception local_68 [2];
  string local_48;
  
  uVar2 = CONCAT71(in_register_00000081,scale) & 0xffffffff;
  sVar3 = (short)*(undefined8 *)
                  (NumericHelper::POWERS_OF_TEN +
                  ((CONCAT71(in_register_00000009,width) & 0xffffffff) - uVar2) * 8);
  lVar5 = (long)input;
  lVar4 = -(long)sVar3;
  bVar1 = SBORROW8(lVar5,lVar4) == lVar5 + sVar3 < 0;
  if ((lVar5 != lVar4 && bVar1) && input < sVar3) {
    *result = (short)input * (short)*(undefined4 *)(NumericHelper::POWERS_OF_TEN + uVar2 * 8);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_68,"Could not cast value %d to DECIMAL(%d,%d)",&local_69);
    Exception::ConstructMessage<int,unsigned_char,unsigned_char>
              (&local_48,local_68,(string *)(ulong)(uint)input,(uint)width,scale,in_R9B);
    ::std::__cxx11::string::~string((string *)local_68);
    HandleCastError::AssignError(&local_48,parameters);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return (lVar5 != lVar4 && bVar1) && input < sVar3;
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}